

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3GetTempRange(Parse *pParse,int nReg)

{
  int in_ESI;
  Parse *in_RDI;
  int n;
  int i;
  int local_18;
  int local_4;
  
  if (in_ESI == 1) {
    local_4 = sqlite3GetTempReg(in_RDI);
  }
  else {
    local_18 = in_RDI->iRangeReg;
    if (in_RDI->nRangeReg < in_ESI) {
      local_18 = in_RDI->nMem + 1;
      in_RDI->nMem = in_ESI + in_RDI->nMem;
    }
    else {
      in_RDI->iRangeReg = in_ESI + in_RDI->iRangeReg;
      in_RDI->nRangeReg = in_RDI->nRangeReg - in_ESI;
    }
    local_4 = local_18;
  }
  return local_4;
}

Assistant:

SQLITE_PRIVATE int sqlite3GetTempRange(Parse *pParse, int nReg){
  int i, n;
  if( nReg==1 ) return sqlite3GetTempReg(pParse);
  i = pParse->iRangeReg;
  n = pParse->nRangeReg;
  if( nReg<=n ){
    pParse->iRangeReg += nReg;
    pParse->nRangeReg -= nReg;
  }else{
    i = pParse->nMem+1;
    pParse->nMem += nReg;
  }
  return i;
}